

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ircbot.cpp
# Opt level: O2

bool __thiscall ircBot::checkping(ircBot *this,char *buff)

{
  int __fd;
  bool bVar1;
  int x;
  size_t sVar2;
  long lVar3;
  char *pcVar4;
  int i;
  ulong uVar5;
  char Pingout [60];
  
  uVar5 = 0;
  pcVar4 = buff;
  while( true ) {
    sVar2 = strlen(buff);
    if (sVar2 <= uVar5) break;
    if (buff[uVar5] == 'P') {
      found = true;
      for (lVar3 = 1; lVar3 != 4; lVar3 = lVar3 + 1) {
        if (pcVar4[lVar3] != "PING "[lVar3]) {
          found = false;
        }
      }
    }
    uVar5 = uVar5 + 1;
    pcVar4 = pcVar4 + 1;
  }
  printf("\n%s\n",buff);
  bVar1 = found;
  Pingout[0x30] = '\0';
  Pingout[0x31] = '\0';
  Pingout[0x32] = '\0';
  Pingout[0x33] = '\0';
  Pingout[0x34] = '\0';
  Pingout[0x35] = '\0';
  Pingout[0x36] = '\0';
  Pingout[0x37] = '\0';
  Pingout[0x38] = '\0';
  Pingout[0x39] = '\0';
  Pingout[0x3a] = '\0';
  Pingout[0x3b] = '\0';
  Pingout[0x20] = '\0';
  Pingout[0x21] = '\0';
  Pingout[0x22] = '\0';
  Pingout[0x23] = '\0';
  Pingout[0x24] = '\0';
  Pingout[0x25] = '\0';
  Pingout[0x26] = '\0';
  Pingout[0x27] = '\0';
  Pingout[0x28] = '\0';
  Pingout[0x29] = '\0';
  Pingout[0x2a] = '\0';
  Pingout[0x2b] = '\0';
  Pingout[0x2c] = '\0';
  Pingout[0x2d] = '\0';
  Pingout[0x2e] = '\0';
  Pingout[0x2f] = '\0';
  Pingout[0x10] = '\0';
  Pingout[0x11] = '\0';
  Pingout[0x12] = '\0';
  Pingout[0x13] = '\0';
  Pingout[0x14] = '\0';
  Pingout[0x15] = '\0';
  Pingout[0x16] = '\0';
  Pingout[0x17] = '\0';
  Pingout[0x18] = '\0';
  Pingout[0x19] = '\0';
  Pingout[0x1a] = '\0';
  Pingout[0x1b] = '\0';
  Pingout[0x1c] = '\0';
  Pingout[0x1d] = '\0';
  Pingout[0x1e] = '\0';
  Pingout[0x1f] = '\0';
  Pingout[0] = '\0';
  Pingout[1] = '\0';
  Pingout[2] = '\0';
  Pingout[3] = '\0';
  Pingout[4] = '\0';
  Pingout[5] = '\0';
  Pingout[6] = '\0';
  Pingout[7] = '\0';
  Pingout[8] = '\0';
  Pingout[9] = '\0';
  Pingout[10] = '\0';
  Pingout[0xb] = '\0';
  Pingout[0xc] = '\0';
  Pingout[0xd] = '\0';
  Pingout[0xe] = '\0';
  Pingout[0xf] = '\0';
  if (found != false) {
    snprintf(Pingout,0x3c,"PONG :%s\r\n");
    __fd = this->sock;
    sVar2 = strlen(Pingout);
    send(__fd,Pingout,sVar2,0);
    printf("PONG: %s\r\n\n",irchost);
  }
  return bVar1;
}

Assistant:

bool ircBot::checkping(char *buff)
{
    
    const char * toSearch = "PING ";

    for (int i = 0; i < strlen(buff);i++) {
    //If the active char is equil to the first search item then search toSearch
            if (buff[i] == toSearch[0]) {
                found = true;
                //search the char array for search field
                for (int x = 1; x < 4; x++) {
                    if (buff[i+x]!=toSearch[x]) {
                    found = false;
                    }
                }
            }
    }

    printf("\n%s\n", buff);
    char Pingout[60];
    memset(Pingout,'\0',60);
    if(found == true)
    {
        snprintf(Pingout,60,"PONG :%s\r\n",buff);
        send(sock,Pingout,strlen(Pingout),0);
        printf("PONG: %s\r\n\n", irchost);
        return 1;
    }
    return 0;
}